

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O3

QList<QSslCertificateExtension> * __thiscall
QSslCertificatePrivate::extensions
          (QList<QSslCertificateExtension> *__return_storage_ptr__,QSslCertificatePrivate *this)

{
  X509Certificate *pXVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int iVar5;
  int iVar6;
  int extraout_var;
  long lVar7;
  long in_FS_OFFSET;
  QSslCertificateExtension ext;
  QSslCertificateExtension local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSslCertificateExtension *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pXVar1 = (this->backend)._M_t.
           super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
           ._M_t.
           super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
           .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
  if (pXVar1 != (X509Certificate *)0x0) {
    iVar5 = (*pXVar1->_vptr_X509Certificate[0x11])();
    if (CONCAT44(extraout_var,iVar5) != 0 && -1 < extraout_var) {
      lVar7 = 0;
      do {
        local_60.d.d.ptr =
             (QSharedDataPointer<QSslCertificateExtensionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QSslCertificateExtension::QSslCertificateExtension(&local_60);
        pXVar1 = (this->backend)._M_t.
                 super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
                 .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
        (*pXVar1->_vptr_X509Certificate[0x12])(&local_58,pXVar1,lVar7);
        if (*(int *)local_60.d.d.ptr != 1) {
          QSharedDataPointer<QSslCertificateExtensionPrivate>::detach_helper(&local_60.d);
        }
        pQVar2 = &((((QString *)((long)local_60.d.d.ptr + 8))->d).d)->super_QArrayData;
        (((QString *)((long)local_60.d.d.ptr + 8))->d).d = (Data *)local_58.shared;
        pcVar3 = *(char16_t **)((long)local_60.d.d.ptr + 0x10);
        *(undefined8 *)((long)local_60.d.d.ptr + 0x10) = local_58._8_8_;
        qVar4 = *(qsizetype *)((long)local_60.d.d.ptr + 0x18);
        *(undefined8 *)((long)local_60.d.d.ptr + 0x18) = local_58._16_8_;
        local_58.shared = (PrivateShared *)pQVar2;
        local_58._8_8_ = pcVar3;
        local_58._16_8_ = qVar4;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
        pXVar1 = (this->backend)._M_t.
                 super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
                 .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
        (*pXVar1->_vptr_X509Certificate[0x13])(&local_58,pXVar1,lVar7);
        if (*(int *)local_60.d.d.ptr != 1) {
          QSharedDataPointer<QSslCertificateExtensionPrivate>::detach_helper(&local_60.d);
        }
        pQVar2 = &((((QString *)((long)local_60.d.d.ptr + 0x20))->d).d)->super_QArrayData;
        pcVar3 = *(char16_t **)((long)local_60.d.d.ptr + 0x28);
        *(undefined4 *)&(((QString *)((long)local_60.d.d.ptr + 0x20))->d).d = local_58._0_4_;
        *(undefined4 *)((long)local_60.d.d.ptr + 0x24) = local_58._4_4_;
        *(undefined4 *)((long)local_60.d.d.ptr + 0x28) = local_58._8_4_;
        *(undefined4 *)((long)local_60.d.d.ptr + 0x2c) = local_58._12_4_;
        qVar4 = *(qsizetype *)((long)local_60.d.d.ptr + 0x30);
        *(undefined8 *)((long)local_60.d.d.ptr + 0x30) = local_58._16_8_;
        local_58.shared = (PrivateShared *)pQVar2;
        local_58._8_8_ = pcVar3;
        local_58._16_8_ = qVar4;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
        pXVar1 = (this->backend)._M_t.
                 super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
                 .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
        (*pXVar1->_vptr_X509Certificate[0x14])(&local_58,pXVar1,lVar7);
        if (*(int *)local_60.d.d.ptr != 1) {
          QSharedDataPointer<QSslCertificateExtensionPrivate>::detach_helper(&local_60.d);
        }
        QVariant::operator=((QVariant *)((long)local_60.d.d.ptr + 0x38),(QVariant *)&local_58);
        QVariant::~QVariant((QVariant *)&local_58);
        pXVar1 = (this->backend)._M_t.
                 super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
                 .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
        iVar6 = (*pXVar1->_vptr_X509Certificate[0x15])(pXVar1,lVar7);
        if (*(int *)local_60.d.d.ptr != 1) {
          QSharedDataPointer<QSslCertificateExtensionPrivate>::detach_helper(&local_60.d);
        }
        *(bool *)((long)local_60.d.d.ptr + 0x58) = SUB41(iVar6,0);
        pXVar1 = (this->backend)._M_t.
                 super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
                 .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl;
        iVar6 = (*pXVar1->_vptr_X509Certificate[0x16])(pXVar1,lVar7);
        if (*(int *)local_60.d.d.ptr != 1) {
          QSharedDataPointer<QSslCertificateExtensionPrivate>::detach_helper(&local_60.d);
        }
        *(bool *)((long)local_60.d.d.ptr + 0x59) = SUB41(iVar6,0);
        QtPrivate::QMovableArrayOps<QSslCertificateExtension>::
        emplace<QSslCertificateExtension_const&>
                  ((QMovableArrayOps<QSslCertificateExtension> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_60);
        QList<QSslCertificateExtension>::end(__return_storage_ptr__);
        QSslCertificateExtension::~QSslCertificateExtension(&local_60);
        lVar7 = lVar7 + 1;
      } while (CONCAT44(extraout_var,iVar5) != lVar7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslCertificateExtension> QSslCertificatePrivate::extensions() const
{
    QList<QSslCertificateExtension> result;

    if (backend.get()) {
        auto nExt = backend->numberOfExtensions();
        for (decltype (nExt) i = 0; i < nExt; ++i) {
            QSslCertificateExtension ext;
            ext.d->oid = backend->oidForExtension(i);
            ext.d->name = backend->nameForExtension(i);
            ext.d->value = backend->valueForExtension(i);
            ext.d->critical = backend->isExtensionCritical(i);
            ext.d->supported = backend->isExtensionSupported(i);
            result << ext;
        }
    }

    return result;
}